

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

string * __thiscall
deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(string *__return_storage_ptr__,Spec *this)

{
  pointer pAVar1;
  string *psVar2;
  ostream *poVar3;
  long lVar4;
  pointer pAVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  stringstream name;
  allocator<char> local_209;
  Spec *local_208;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pAVar5 = (this->arrays).
           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (this->arrays).
           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_208 = this;
  if (pAVar1 != pAVar5) {
    bVar9 = 0x40 < (ulong)((long)pAVar1 - (long)pAVar5);
    lVar8 = 0;
    uVar6 = 0;
    do {
      if (bVar9) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"array",5);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,
                 Array::storageToString::storages[*(int *)((long)&pAVar5->storage + lVar8)],
                 (allocator<char> *)&local_200);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_1e0,local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)&pAVar5->offset + lVar8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)&pAVar5->stride + lVar8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,
                 Array::inputTypeToString::types[*(int *)((long)&pAVar5->inputType + lVar8)],
                 &local_209);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_200,local_1f8);
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
      }
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      if ((*(uint *)((long)&pAVar5->inputType + lVar8) & 0xfffffffe) != 10) {
        std::ostream::operator<<
                  ((ostream *)local_1a8,*(int *)((long)&pAVar5->componentCount + lVar8));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
      bVar9 = (&pAVar5->normalize)[lVar8] != false;
      pcVar7 = glcts::fixed_sample_locations_values + 1;
      if (bVar9) {
        pcVar7 = "normalized_";
      }
      lVar4 = 0;
      if (bVar9) {
        lVar4 = 0xb;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,
                 Array::outputTypeToString::types[*(int *)((long)&pAVar5->outputType + lVar8)],
                 (allocator<char> *)&local_200);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_1e0,local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,
                 Array::usageTypeToString::usages[*(int *)((long)&pAVar5->usage + lVar8)],&local_209
                );
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_200,local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
      }
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      uVar6 = uVar6 + 1;
      pAVar5 = (local_208->arrays).
               super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x40;
      bVar9 = true;
    } while (uVar6 < (ulong)((long)(local_208->arrays).
                                   super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar5 >> 6));
  }
  psVar2 = local_1c0;
  if (local_208->first != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"first",5);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_208->first);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
  }
  if (local_208->primitive == PRIMITIVE_TRIANGLES) {
    lVar8 = 6;
    pcVar7 = "quads_";
  }
  else {
    if (local_208->primitive != PRIMITIVE_POINTS) goto LAB_01896455;
    lVar8 = 7;
    pcVar7 = "points_";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar8);
LAB_01896455:
  std::ostream::operator<<(local_1a8,local_208->drawCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar2;
}

Assistant:

std::string MultiVertexArrayTest::Spec::getName (void) const
{
	std::stringstream name;

	for (size_t ndx = 0; ndx < arrays.size(); ++ndx)
	{
		const ArraySpec& array = arrays[ndx];

		if (arrays.size() > 1)
			name << "array" << ndx << "_";

		name
			<< Array::storageToString(array.storage) << "_"
			<< array.offset << "_"
			<< array.stride << "_"
			<< Array::inputTypeToString((Array::InputType)array.inputType);
		if (array.inputType != Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 && array.inputType != Array::INPUTTYPE_INT_2_10_10_10)
			name << array.componentCount;
		name
			<< "_"
			<< (array.normalize ? "normalized_" : "")
			<< Array::outputTypeToString(array.outputType) << "_"
			<< Array::usageTypeToString(array.usage) << "_";
	}

	if (first)
		name << "first" << first << "_";

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			name << "quads_";
			break;
		case Array::PRIMITIVE_POINTS:
			name << "points_";
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	name << drawCount;

	return name.str();
}